

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

void __thiscall Polynom<Rational>::extend(Polynom<Rational> *this,uint sz)

{
  uint uVar1;
  uint in_ESI;
  Matrix<Rational> *in_RDI;
  Matrix<Rational> *unaff_retaddr;
  Matrix<Rational> *in_stack_00000020;
  Matrix<Rational> *in_stack_00000028;
  Matrix<Rational> *in_stack_00000040;
  undefined4 in_stack_00000048;
  undefined4 in_stack_ffffffffffffffc4;
  Matrix<Rational> *pMVar2;
  
  pMVar2 = in_RDI;
  uVar1 = Matrix<Rational>::width(in_RDI);
  if (uVar1 < in_ESI) {
    Matrix<Rational>::width(in_RDI);
    Matrix<Rational>::Matrix(unaff_retaddr,(uint)((ulong)pMVar2 >> 0x20),(uint)pMVar2);
    Matrix<Rational>::joinHorizontal
              ((Matrix<Rational> *)CONCAT44(sz,in_stack_00000048),in_stack_00000040);
    Matrix<Rational>::operator=(in_stack_00000028,in_stack_00000020);
    Matrix<Rational>::~Matrix((Matrix<Rational> *)CONCAT44(in_stack_ffffffffffffffc4,in_ESI));
    Matrix<Rational>::~Matrix((Matrix<Rational> *)CONCAT44(in_stack_ffffffffffffffc4,in_ESI));
  }
  return;
}

Assistant:

void Polynom<Field>::extend(unsigned sz)
{
    if(sz > m.width())
        m = Matrix<Field>(1, sz - m.width()).joinHorizontal(m);
}